

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> * __thiscall
pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
          (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this,
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *other)

{
  bool bVar1;
  size_t sVar2;
  iterator pfVar3;
  reference args;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  size_t i_1;
  int i;
  polymorphic_allocator<float> *in_stack_ffffffffffffffb8;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffffc0;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  size_t in_stack_ffffffffffffffd8;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar6;
  
  if (in_RDI != in_RSI) {
    clear(in_stack_ffffffffffffffc0);
    bVar1 = pstd::pmr::operator==(&in_stack_ffffffffffffffc0->alloc,in_stack_ffffffffffffffb8);
    if (bVar1) {
      pstd::swap<float*>(&in_RDI->ptr,&in_RSI->ptr);
      pstd::swap<unsigned_long>(&in_RDI->nAlloc,&in_RSI->nAlloc);
      pstd::swap<unsigned_long>(&in_RDI->nStored,&in_RSI->nStored);
      if ((in_RDI->nStored != 0) && (in_RDI->ptr == (float *)0x0)) {
        for (iVar6 = 0; (ulong)(long)iVar6 < in_RDI->nStored; iVar6 = iVar6 + 1) {
          pstd::pmr::polymorphic_allocator<float>::construct<float,float>
                    (&in_RDI->alloc,(float *)((long)&in_RDI->field_2 + (long)iVar6 * 4),
                     (float *)((long)&in_RSI->field_2 + (long)iVar6 * 4));
        }
        in_RSI->nStored = in_RDI->nStored;
      }
    }
    else {
      size(in_RSI);
      reserve((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              in_stack_ffffffffffffffd8);
      uVar4 = 0;
      while (uVar5 = uVar4, sVar2 = size(in_RSI), uVar4 < sVar2) {
        pfVar3 = begin(in_RDI);
        this_00 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                  (pfVar3 + uVar5);
        args = operator[](this_00,(size_type)in_stack_ffffffffffffffb8);
        pstd::pmr::polymorphic_allocator<float>::construct<float,float>
                  (&in_RDI->alloc,(float *)this_00,args);
        uVar4 = uVar5 + 1;
      }
      sVar2 = size(in_RSI);
      in_RDI->nStored = sVar2;
    }
  }
  return in_RDI;
}

Assistant:

InlinedVector &operator=(InlinedVector &&other) {
        if (this == &other)
            return *this;

        clear();
        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
            if (nStored > 0 && ptr == nullptr) {
                for (int i = 0; i < nStored; ++i)
                    alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
                other.nStored = nStored;  // so that dtors run...
            }
        } else {
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(begin() + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }